

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O0

TValue * luaH_getint(Table *t,lua_Integer key)

{
  int iVar1;
  Node *pNStack_28;
  int nx;
  Node *n;
  lua_Integer key_local;
  Table *t_local;
  
  if (key - 1U < (ulong)t->sizearray) {
    t_local = (Table *)(t->array + key + -1);
  }
  else {
    pNStack_28 = t->node + (key & (ulong)t->hmask);
    while( true ) {
      if (((pNStack_28->i_key).nk.tt_ == 0x13) &&
         ((pNStack_28->i_key).nk.value_.gc == (GCObject *)key)) {
        return &pNStack_28->i_val;
      }
      iVar1 = (pNStack_28->i_key).nk.next;
      if (iVar1 == 0) break;
      pNStack_28 = pNStack_28 + iVar1;
    }
    t_local = (Table *)&luaO_nilobject_;
  }
  return (TValue *)t_local;
}

Assistant:

const TValue *luaH_getint (Table *t, lua_Integer key) {
  /* (1 <= key && key <= t->sizearray) */
  if (l_castS2U(key) - 1 < t->sizearray)
    return &t->array[key - 1];
  else {
    Node *n = hashint(t, key);
    for (;;) {  /* check whether 'key' is somewhere in the chain */
      if (keyisinteger(n) && keyival(n) == key)
        return gval(n);  /* that's it */
      else {
        int nx = gnext(n);
        if (nx == 0) break;
        n += nx;
      }
    }
    return luaO_nilobject;
  }
}